

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *this;
  string_t *idata_00;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **states_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  string_t element;
  string_t element_00;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_c0;
  long local_b8;
  long local_b0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  long *local_78;
  long local_70;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if (((*(byte **)(input + 0x28) == (byte *)0x0) || ((**(byte **)(input + 0x28) & 1) != 0)) &&
       (count != 0)) {
      paVar1 = *(anon_union_16_2_67f50693_for_value **)(input + 0x20);
      this = (QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *)
             **(undefined8 **)(states + 0x20);
      do {
        QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                  (this,(string_t)paVar1->pointer,aggr_input_data);
        count = count - 1;
      } while (count != 0);
    }
  }
  else {
    if (*input == (Vector)0x0 && *states == (Vector)0x0) {
      idata_00 = *(string_t **)(input + 0x20);
      states_00 = *(QuantileState<duckdb::string_t,_duckdb::QuantileStringType> ***)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      UnaryFlatLoop<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::string_t,duckdb::QuantileListOperation<duckdb::string_t,true>>
                (idata_00,aggr_input_data,states_00,(ValidityMask *)(input + 0x28),count);
      return;
    }
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
    duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
    if (local_b0 == 0) {
      if (count != 0) {
        uVar4 = 0;
        do {
          uVar2 = uVar4;
          if (*local_c0 != 0) {
            uVar2 = (ulong)*(uint *)(*local_c0 + uVar4 * 4);
          }
          uVar3 = uVar4;
          if (*local_78 != 0) {
            uVar3 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
          }
          element_00.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + uVar2 * 0x10);
          element_00.value._0_8_ = *(undefined8 *)(local_b8 + uVar2 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    (*(QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **)
                      (local_70 + uVar3 * 8),element_00,aggr_input_data);
          uVar4 = uVar4 + 1;
        } while (count != uVar4);
      }
    }
    else if (count != 0) {
      uVar4 = 0;
      do {
        uVar2 = uVar4;
        if (*local_c0 != 0) {
          uVar2 = (ulong)*(uint *)(*local_c0 + uVar4 * 4);
        }
        uVar3 = uVar4;
        if (*local_78 != 0) {
          uVar3 = (ulong)*(uint *)(*local_78 + uVar4 * 4);
        }
        if ((local_b0 == 0) ||
           ((*(ulong *)(local_b0 + (uVar2 >> 6) * 8) >> (uVar2 & 0x3f) & 1) != 0)) {
          element.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + uVar2 * 0x10);
          element.value._0_8_ = *(undefined8 *)(local_b8 + uVar2 * 0x10);
          QuantileState<duckdb::string_t,_duckdb::QuantileStringType>::AddElement
                    (*(QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **)
                      (local_70 + uVar3 * 8),element,aggr_input_data);
        }
        uVar4 = uVar4 + 1;
      } while (count != uVar4);
    }
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
    }
    if (local_80 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80);
    }
    if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
    }
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}